

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::EventModuleField,_std::default_delete<wabt::EventModuleField>_> *field)

{
  value_type __args;
  pointer pEVar1;
  ulong uVar2;
  size_type sVar3;
  unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> local_60;
  value_type local_58;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_true>
  local_50;
  Binding local_48;
  value_type local_20;
  Event *event;
  unique_ptr<wabt::EventModuleField,_std::default_delete<wabt::EventModuleField>_> *field_local;
  Module *this_local;
  
  event = (Event *)field;
  field_local = (unique_ptr<wabt::EventModuleField,_std::default_delete<wabt::EventModuleField>_> *)
                this;
  pEVar1 = std::unique_ptr<wabt::EventModuleField,_std::default_delete<wabt::EventModuleField>_>::
           operator->(field);
  local_20 = &pEVar1->event;
  uVar2 = std::__cxx11::string::empty();
  __args = local_20;
  if ((uVar2 & 1) == 0) {
    pEVar1 = std::unique_ptr<wabt::EventModuleField,_std::default_delete<wabt::EventModuleField>_>::
             operator->(field);
    sVar3 = std::vector<wabt::Event_*,_std::allocator<wabt::Event_*>_>::size(&this->events);
    Binding::Binding(&local_48,
                     &(pEVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.
                      loc,(Index)sVar3);
    local_50._M_cur =
         (__node_type *)
         std::
         unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
         ::emplace<std::__cxx11::string&,wabt::Binding>
                   ((unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
                     *)&this->event_bindings,&__args->name,&local_48);
  }
  local_58 = local_20;
  std::vector<wabt::Event_*,_std::allocator<wabt::Event_*>_>::push_back(&this->events,&local_58);
  std::unique_ptr<wabt::ModuleField,std::default_delete<wabt::ModuleField>>::
  unique_ptr<wabt::EventModuleField,std::default_delete<wabt::EventModuleField>,void>
            ((unique_ptr<wabt::ModuleField,std::default_delete<wabt::ModuleField>> *)&local_60,field
            );
  intrusive_list<wabt::ModuleField>::push_back(&this->fields,&local_60);
  std::unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>::~unique_ptr
            (&local_60);
  return;
}

Assistant:

void Module::AppendField(std::unique_ptr<EventModuleField> field) {
  Event& event = field->event;
  if (!event.name.empty()) {
    event_bindings.emplace(event.name, Binding(field->loc, events.size()));
  }
  events.push_back(&event);
  fields.push_back(std::move(field));
}